

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMan.c
# Opt level: O3

Cov_Man_t * Cov_ManAlloc(Abc_Ntk_t *pNtk,int nFaninMax,int nCubesMax)

{
  uint uVar1;
  Cov_Man_t *pCVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  void *__s;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  ulong uVar7;
  long lVar8;
  Min_Man_t *pMVar9;
  int iVar10;
  Vec_Ptr_t *pVVar11;
  long lVar12;
  int Entry;
  size_t __size;
  uint uVar13;
  
  if (pNtk->pManCut != (void *)0x0) {
    __assert_fail("pNtk->pManCut == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMan.c"
                  ,0x33,"Cov_Man_t *Cov_ManAlloc(Abc_Ntk_t *, int, int)");
  }
  Entry = 0x78;
  pCVar2 = (Cov_Man_t *)calloc(1,0x78);
  pCVar2->nFaninMax = nFaninMax;
  pCVar2->nCubesMax = nCubesMax;
  pCVar2->nWords = ((nFaninMax >> 4) + 1) - (uint)((nFaninMax & 0xfU) == 0);
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < nFaninMax * 2 - 1U) {
    iVar10 = nFaninMax * 2;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar10;
  if (iVar10 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar10 * 4);
  }
  pVVar3->pArray = piVar4;
  pCVar2->vComTo0 = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar10;
  if (iVar10 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar10 << 2);
  }
  pVVar3->pArray = piVar4;
  pCVar2->vComTo1 = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < nFaninMax - 1U) {
    iVar10 = nFaninMax;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar10;
  if (iVar10 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar10 * 4);
  }
  pVVar3->pArray = piVar4;
  pCVar2->vPairs0 = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar10;
  if (iVar10 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar10 << 2);
  }
  pVVar3->pArray = piVar4;
  pCVar2->vPairs1 = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 0x10;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(0x40);
  pVVar3->pArray = piVar4;
  pCVar2->vTriv0 = pVVar3;
  Vec_IntPush(pVVar3,Entry);
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 0x10;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(0x40);
  pVVar3->pArray = piVar4;
  pCVar2->vTriv1 = pVVar3;
  Vec_IntPush(pVVar3,Entry);
  pVVar11 = pNtk->vObjs;
  uVar1 = pVVar11->nSize;
  lVar12 = (long)(int)uVar1;
  __s = malloc(lVar12 << 10);
  pCVar2->pMemory = __s;
  memset(__s,0,lVar12 << 5);
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  uVar13 = 8;
  if (6 < uVar1 - 1) {
    uVar13 = uVar1;
  }
  pVVar5->nCap = uVar13;
  if (uVar13 == 0) {
    pVVar5->pArray = (void **)0x0;
    pCVar2->vObjStrs = pVVar5;
    if ((int)uVar1 < 1) goto LAB_0044b79c;
    __size = (ulong)uVar1 * 8;
LAB_0044b751:
    ppvVar6 = (void **)malloc(__size);
LAB_0044b75e:
    pVVar5->pArray = ppvVar6;
    pVVar5->nCap = uVar1;
  }
  else {
    ppvVar6 = (void **)malloc((long)(int)uVar13 << 3);
    pVVar5->pArray = ppvVar6;
    pCVar2->vObjStrs = pVVar5;
    if ((int)uVar13 < (int)uVar1) {
      __size = lVar12 * 8;
      if (ppvVar6 == (void **)0x0) goto LAB_0044b751;
      ppvVar6 = (void **)realloc(ppvVar6,__size);
      goto LAB_0044b75e;
    }
  }
  if (0 < (int)uVar1) {
    uVar7 = 0;
    do {
      pVVar5->pArray[uVar7] = (void *)0x0;
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
    pVVar11 = pNtk->vObjs;
  }
LAB_0044b79c:
  pVVar5->nSize = uVar1;
  if (0 < pVVar11->nSize) {
    lVar8 = 0;
    do {
      if (pVVar11->pArray[lVar8] != (void *)0x0) {
        if (lVar12 <= lVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        pVVar5->pArray[lVar8] = __s;
        pVVar11 = pNtk->vObjs;
      }
      lVar8 = lVar8 + 1;
      __s = (void *)((long)__s + 0x20);
    } while (lVar8 < pVVar11->nSize);
  }
  pMVar9 = Min_ManAlloc(nFaninMax);
  pCVar2->pManMin = pMVar9;
  return pCVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Cov_Man_t * Cov_ManAlloc( Abc_Ntk_t * pNtk, int nFaninMax, int nCubesMax )
{
    Cov_Man_t * pMan;
    Cov_Obj_t * pMem;
    Abc_Obj_t * pObj;
    int i;
    assert( pNtk->pManCut == NULL );

    // start the manager
    pMan = ABC_ALLOC( Cov_Man_t, 1 );
    memset( pMan, 0, sizeof(Cov_Man_t) );
    pMan->nFaninMax = nFaninMax;
    pMan->nCubesMax = nCubesMax;
    pMan->nWords    = Abc_BitWordNum( nFaninMax * 2 );

    // get the cubes
    pMan->vComTo0 = Vec_IntAlloc( 2*nFaninMax );
    pMan->vComTo1 = Vec_IntAlloc( 2*nFaninMax );
    pMan->vPairs0 = Vec_IntAlloc( nFaninMax );
    pMan->vPairs1 = Vec_IntAlloc( nFaninMax );
    pMan->vTriv0  = Vec_IntAlloc( 1 );  Vec_IntPush( pMan->vTriv0, -1 ); 
    pMan->vTriv1  = Vec_IntAlloc( 1 );  Vec_IntPush( pMan->vTriv1, -1 ); 

    // allocate memory for object structures
    pMan->pMemory = pMem = ABC_ALLOC( Cov_Obj_t, sizeof(Cov_Obj_t) * Abc_NtkObjNumMax(pNtk) );
    memset( pMem, 0, sizeof(Cov_Obj_t) * Abc_NtkObjNumMax(pNtk) );
    // allocate storage for the pointers to the memory
    pMan->vObjStrs = Vec_PtrAlloc( Abc_NtkObjNumMax(pNtk) );
    Vec_PtrFill( pMan->vObjStrs, Abc_NtkObjNumMax(pNtk), NULL );
    Abc_NtkForEachObj( pNtk, pObj, i )
        Vec_PtrWriteEntry( pMan->vObjStrs, i, pMem + i );
    // create the cube manager
    pMan->pManMin = Min_ManAlloc( nFaninMax );
    return pMan;
}